

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O3

void prf_texture_entry_f(prf_node_t *node,prf_state_t *state)

{
  prf_node_t **pppVar1;
  
  if (node->opcode == prf_texture_info.opcode) {
    pppVar1 = (prf_node_t **)prf_array_append_ptr(state->textures,node);
    state->textures = pppVar1;
    return;
  }
  prf_error(9,"texture entry state method tried on node of type %d.");
  return;
}

Assistant:

static
void
prf_texture_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_texture_info.opcode ) {
        prf_error( 9, "texture entry state method tried on node of type %d.",
                   node->opcode );
        return;
    }
    state->textures =
        (prf_node_t **) prf_array_append_ptr( state->textures, node );
}